

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMemoryStressTests.cpp
# Opt level: O0

IterateResult __thiscall deqp::egl::MemoryStressCase::iterate(MemoryStressCase *this)

{
  int iVar1;
  bool bVar2;
  MemoryAllocator *pMVar3;
  MessageBuilder *pMVar4;
  string *value;
  float *pfVar5;
  reference pvVar6;
  size_type sVar7;
  MessageBuilder local_b10;
  float local_98c;
  undefined1 local_988 [4];
  float change;
  int local_808;
  float local_804;
  int allocNdx;
  float threshold;
  int max;
  int min;
  int local_4e4;
  MessageBuilder local_4e0;
  int local_35c;
  int local_358;
  int local_354;
  MessageBuilder local_350;
  int local_1cc;
  MessageBuilder local_1c8;
  TestLog *local_38;
  TestLog *log;
  MemoryStressCase *this_local;
  
  log = (TestLog *)this;
  local_38 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  if (this->m_iteration < this->m_iterationCount) {
    if (this->m_allocator == (MemoryAllocator *)0x0) {
      pMVar3 = (MemoryAllocator *)operator_new(0x1ac0);
      egl::anon_unknown_0::MemoryAllocator::MemoryAllocator
                (pMVar3,(this->super_TestCase).m_eglTestCtx,this->m_display,this->m_config,
                 this->m_seed,(this->m_spec).types,(this->m_spec).minWidth,(this->m_spec).minHeight,
                 (this->m_spec).maxWidth,(this->m_spec).maxHeight,(bool)((this->m_spec).use & 1));
      this->m_allocator = pMVar3;
    }
    bVar2 = egl::anon_unknown_0::MemoryAllocator::allocateUntilFailure(this->m_allocator);
    if (bVar2) {
      tcu::TestLog::operator<<(&local_1c8,local_38,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar4 = tcu::MessageBuilder::operator<<
                         (&local_1c8,
                          (char (*) [51])"Couldn\'t exhaust memory before timeout. Allocated ");
      local_1cc = egl::anon_unknown_0::MemoryAllocator::getAllocationCount(this->m_allocator);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_1cc);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [10])0x2a914c4);
      tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_1c8);
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
      pMVar3 = this->m_allocator;
      if (pMVar3 != (MemoryAllocator *)0x0) {
        egl::anon_unknown_0::MemoryAllocator::~MemoryAllocator(pMVar3);
        operator_delete(pMVar3,0x1ac0);
      }
      this->m_allocator = (MemoryAllocator *)0x0;
      this_local._4_4_ = STOP;
    }
    else {
      tcu::TestLog::operator<<(&local_350,local_38,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar4 = tcu::MessageBuilder::operator<<(&local_350,(char (*) [11])0x2c1053d);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&this->m_iteration);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [13])": Allocated ");
      local_354 = egl::anon_unknown_0::MemoryAllocator::getAllocationCount(this->m_allocator);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_354);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [11])" objects; ");
      local_358 = egl::anon_unknown_0::MemoryAllocator::getContextCount(this->m_allocator);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_358);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [12])" contexts, ");
      local_35c = egl::anon_unknown_0::MemoryAllocator::getPBufferCount(this->m_allocator);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_35c);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [11])" PBuffers.");
      tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_350);
      tcu::TestLog::operator<<(&local_4e0,local_38,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar4 = tcu::MessageBuilder::operator<<(&local_4e0,(char (*) [21])"Got expected error: ");
      value = egl::(anonymous_namespace)::MemoryAllocator::getErrorString_abi_cxx11_
                        ((MemoryAllocator *)this->m_allocator);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,value);
      tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_4e0);
      local_4e4 = egl::anon_unknown_0::MemoryAllocator::getAllocationCount(this->m_allocator);
      std::vector<int,_std::allocator<int>_>::push_back(&this->m_allocationCounts,&local_4e4);
      pMVar3 = this->m_allocator;
      if (pMVar3 != (MemoryAllocator *)0x0) {
        egl::anon_unknown_0::MemoryAllocator::~MemoryAllocator(pMVar3);
        operator_delete(pMVar3,0x1ac0);
      }
      this->m_allocator = (MemoryAllocator *)0x0;
      this->m_iteration = this->m_iteration + 1;
      this_local._4_4_ = CONTINUE;
    }
  }
  else {
    pfVar5 = (float *)std::vector<int,_std::allocator<int>_>::operator[]
                                (&this->m_allocationCounts,0);
    threshold = *pfVar5;
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&this->m_allocationCounts,0);
    allocNdx = *pvVar6;
    local_804 = 50.0;
    for (local_808 = 0; iVar1 = local_808,
        sVar7 = std::vector<int,_std::allocator<int>_>::size(&this->m_allocationCounts),
        iVar1 < (int)sVar7; local_808 = local_808 + 1) {
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&this->m_allocationCounts,(long)local_808);
      threshold = (float)::deMin32(*pvVar6,(int)threshold);
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&this->m_allocationCounts,(long)local_808);
      allocNdx = ::deMax32(*pvVar6,allocNdx);
    }
    if ((threshold == 0.0) && (allocNdx != 0)) {
      tcu::TestLog::operator<<
                ((MessageBuilder *)local_988,local_38,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar4 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_988,(char (*) [22])"Allocation count zero");
      tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_988);
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Fail");
    }
    else {
      local_98c = (float)((int)threshold - allocNdx) / (float)allocNdx;
      if (local_98c <= local_804) {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_PASS,"Pass");
      }
      else {
        tcu::TestLog::operator<<(&local_b10,local_38,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar4 = tcu::MessageBuilder::operator<<
                           (&local_b10,(char (*) [24])"Allocated objects max: ");
        pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&allocNdx);
        pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [8])", min: ");
        pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(int *)&threshold);
        pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [15])", difference: ");
        pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_98c);
        pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [14])"% threshold: ");
        pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_804);
        pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [2])0x2b9d359);
        tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_b10);
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_QUALITY_WARNING,"Allocation count variation");
      }
    }
    this_local._4_4_ = STOP;
  }
  return this_local._4_4_;
}

Assistant:

TestCase::IterateResult MemoryStressCase::iterate (void)
{
	TestLog& log = m_testCtx.getLog();

	if (m_iteration < m_iterationCount)
	{
		try
		{
			if (!m_allocator)
				m_allocator = new MemoryAllocator(m_eglTestCtx, m_display, m_config, m_seed, m_spec.types, m_spec.minWidth, m_spec.minHeight, m_spec.maxWidth, m_spec.maxHeight, m_spec.use);

			if (m_allocator->allocateUntilFailure())
			{
				log << TestLog::Message << "Couldn't exhaust memory before timeout. Allocated " << m_allocator->getAllocationCount() << " objects." << TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

				delete m_allocator;
				m_allocator = NULL;

				return STOP;
			}

			log << TestLog::Message << "Iteration " << m_iteration << ": Allocated " << m_allocator->getAllocationCount() << " objects; " << m_allocator->getContextCount() << " contexts, " << m_allocator->getPBufferCount() << " PBuffers." << TestLog::EndMessage;
			log << TestLog::Message << "Got expected error: " << m_allocator->getErrorString() << TestLog::EndMessage;
			m_allocationCounts.push_back(m_allocator->getAllocationCount());

			delete m_allocator;
			m_allocator = NULL;

			m_iteration++;

			return CONTINUE;
		} catch (...)
		{
			log << TestLog::Message << "Iteration " << m_iteration << ": Allocated " << m_allocator->getAllocationCount() << " objects; " << m_allocator->getContextCount() << " contexts, " << m_allocator->getPBufferCount() << " PBuffers." << TestLog::EndMessage;
			log << TestLog::Message << "Unexpected error" << TestLog::EndMessage;
			throw;
		}
	}
	else
	{
		// Analyze number of passed allocations.
		int min = m_allocationCounts[0];
		int max = m_allocationCounts[0];

		float threshold = 50.0f;

		for (int allocNdx = 0; allocNdx < (int)m_allocationCounts.size(); allocNdx++)
		{
			min = deMin32(m_allocationCounts[allocNdx], min);
			max = deMax32(m_allocationCounts[allocNdx], max);
		}

		if (min == 0 && max != 0)
		{
			log << TestLog::Message << "Allocation count zero" << TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
		else
		{
			float change = (float)(min - max) / ((float)(max));

			if (change > threshold)
			{
				log << TestLog::Message << "Allocated objects max: " << max << ", min: " << min << ", difference: " << change << "% threshold: " << threshold << "%" << TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_QUALITY_WARNING, "Allocation count variation");
			}
			else
				m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		}

		return STOP;
	}
}